

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  uint uVar1;
  pointer pEVar2;
  FreeNode *pFVar3;
  IntervalMap<int,_int,_0U> *__s;
  uint32_t end;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint level_00;
  
  level_00 = level - 1;
  if (level_00 == 0) {
    __s = (this->super_const_iterator).map;
    uVar5 = ((this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset;
    uVar4 = __s->rootSize;
    if (uVar4 != uVar5 + 1) {
      do {
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        *(undefined8 *)((long)&__s->field_0 + uVar6 * 8) =
             *(undefined8 *)((long)&__s->field_0 + (ulong)uVar5 * 8);
        *(undefined8 *)((long)&__s->field_0 + uVar6 * 8 + 0x60) =
             *(undefined8 *)((long)&__s->field_0 + (ulong)uVar5 * 8 + 0x60);
      } while (uVar4 - 1 != uVar5);
    }
    uVar4 = __s->rootSize - 1;
    __s->rootSize = uVar4;
    ((this->super_const_iterator).path.path.
     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size = uVar4;
    if (uVar4 == 0) {
      memset(__s,0,0xc4);
      const_iterator::setRoot(&this->super_const_iterator,0);
      return;
    }
  }
  else {
    pEVar2 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pFVar3 = (FreeNode *)pEVar2[level_00].node;
    uVar4 = pEVar2[level_00].size;
    if (uVar4 == 1) {
      pFVar3->next = alloc->freeList;
      alloc->freeList = pFVar3;
      eraseNode(this,level_00,alloc);
    }
    else {
      if (uVar4 != pEVar2[level_00].offset + 1) {
        uVar5 = pEVar2[level_00].offset;
        do {
          uVar1 = uVar5 + 1;
          pFVar3[uVar5].next = pFVar3[uVar1].next;
          pFVar3[(ulong)uVar5 + 0xc].next = pFVar3[(ulong)uVar1 + 0xc].next;
          uVar5 = uVar1;
        } while (uVar4 - 1 != uVar1);
      }
      pEVar2 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar2[level_00].size = uVar4 - 1;
      *(ulong *)((long)pEVar2[level - 2].node + (ulong)pEVar2[level - 2].offset * 8) =
           *(ulong *)((long)pEVar2[level - 2].node + (ulong)pEVar2[level - 2].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar4 - 2);
      recomputeBounds(this,level_00);
    }
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar2 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar2->offset < pEVar2->size)) {
    pEVar2 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar6 = *(ulong *)((long)pEVar2[level_00].node + (ulong)pEVar2[level_00].offset * 8);
    pEVar2[level].node = (void *)(uVar6 & 0xffffffffffffffc0);
    pEVar2[level].size = ((uint)uVar6 & 0x3f) + 1;
    (this->super_const_iterator).path.path.
    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[level].offset = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}